

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O2

Uint32 Diligent::FindResource
                 (PipelineResourceDesc *Resources,Uint32 NumResources,SHADER_TYPE ShaderStage,
                 char *ResourceName)

{
  int iVar1;
  ulong uVar2;
  SHADER_TYPE *pSVar3;
  string msg;
  
  if ((ResourceName == (char *)0x0) || (*ResourceName == '\0')) {
    FormatString<char[26],char[51]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResourceName != nullptr && ResourceName[0] != \'\\0\'",
               (char (*) [51])ResourceName);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"FindResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x163);
    std::__cxx11::string::~string((string *)&msg);
  }
  pSVar3 = &Resources->ShaderStages;
  uVar2 = 0;
  while( true ) {
    if (NumResources == uVar2) {
      return 0xffffffff;
    }
    if (((*pSVar3 & ShaderStage) != SHADER_TYPE_UNKNOWN) &&
       (iVar1 = strcmp(((PipelineResourceDesc *)(pSVar3 + -2))->Name,ResourceName), iVar1 == 0))
    break;
    uVar2 = uVar2 + 1;
    pSVar3 = pSVar3 + 6;
  }
  return (Uint32)uVar2;
}

Assistant:

Uint32 FindResource(const PipelineResourceDesc Resources[],
                    Uint32                     NumResources,
                    SHADER_TYPE                ShaderStage,
                    const char*                ResourceName)
{
    VERIFY_EXPR(ResourceName != nullptr && ResourceName[0] != '\0');
    for (Uint32 r = 0; r < NumResources; ++r)
    {
        const PipelineResourceDesc& ResDesc{Resources[r]};
        if ((ResDesc.ShaderStages & ShaderStage) != 0 && strcmp(ResDesc.Name, ResourceName) == 0)
            return r;
    }

    return InvalidPipelineResourceIndex;
}